

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_60._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60._M_string_length =
       (size_type)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count
           + 1;
    }
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/TM","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_60.field_2,&local_60);
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&local_60.field_2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.field_2._8_8_);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
  }
  if (bVar1) {
    local_60._M_dataplus._M_p =
         (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60._M_string_length =
         (size_type)
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/TM","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_60.field_2,&local_60);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              (__return_storage_ptr__,(QPDFObjectHandle *)&local_60.field_2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.field_2._8_8_);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
    }
  }
  else {
    getAlternativeName_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getMappingName()
{
    if (oh().getKey("/TM").isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper TM present");
        return oh().getKey("/TM").getUTF8Value();
    }
    QTC::TC("qpdf", "QPDFFormFieldObjectHelper TM absent");
    return getAlternativeName();
}